

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * __thiscall
doctest::detail::
stringifyBinaryExpr<std::vector<graphics101::Triangle,std::allocator<graphics101::Triangle>>,std::vector<graphics101::Triangle,std::allocator<graphics101::Triangle>>>
          (String *__return_storage_ptr__,detail *this,
          vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_> *lhs,char *op,
          vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_> *rhs)

{
  String local_98;
  String local_70;
  String local_58;
  String local_40;
  vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_> *local_28;
  vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_> *rhs_local;
  char *op_local;
  vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_> *lhs_local;
  
  local_28 = (vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_> *)op;
  rhs_local = lhs;
  op_local = (char *)this;
  lhs_local = (vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_> *)
              __return_storage_ptr__;
  toString<std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>,_true>
            (&local_58,(vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_> *)this
            );
  String::String(&local_70,(char *)rhs_local);
  String::operator+(&local_40,&local_58,&local_70);
  toString<std::vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>,_true>
            (&local_98,local_28);
  String::operator+(__return_storage_ptr__,&local_40,&local_98);
  String::~String(&local_98);
  String::~String(&local_40);
  String::~String(&local_70);
  String::~String(&local_58);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
        return toString(lhs) + op + toString(rhs);
    }